

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * __thiscall
units::probeUnitBase_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  pointer pcVar4;
  double dVar5;
  long lVar6;
  bool bVar7;
  unit_data uVar8;
  long *plVar9;
  undefined8 *puVar10;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar11;
  size_type *psVar12;
  long *plVar13;
  ulong *puVar14;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 numOnly;
  bool numOnly_00;
  byte *pbVar15;
  ulong uVar16;
  precise_unit pVar17;
  string prefix;
  __string_type __str;
  unit base;
  string beststr;
  string fnd;
  size_t cut;
  unit in_stack_fffffffffffffe48;
  string local_1b0;
  long *local_190;
  ulong local_188;
  long local_180;
  undefined8 uStack_178;
  double local_170;
  undefined8 local_168;
  double local_160;
  char *local_158;
  size_type local_150;
  char local_148;
  undefined7 uStack_147;
  undefined8 uStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  string *local_118;
  long local_110;
  string local_108;
  ulong local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  size_t local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_158 = &local_148;
  local_150 = 0;
  local_148 = '\0';
  local_170 = *(double *)this;
  local_160 = un->multiplier_;
  uVar8 = detail::unit_data::operator*((unit_data *)(this + 8),&un->base_units_);
  local_168 = CONCAT44(uVar8,0x3f800000);
  find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
  local_170 = local_170 * local_160;
  if (local_110 != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_118,(long)&(local_118->_M_dataplus)._M_p + local_110);
    generateUnitSequence(&local_1b0,local_170,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_190 = &local_180;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_190,local_188,0,'\x01');
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_190);
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar12) {
      lVar6 = plVar9[3];
      paVar1->_M_allocated_capacity = *psVar12;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    }
    __return_storage_ptr__->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    pbVar15 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    bVar3 = *pbVar15;
    if (((byte)(bVar3 - 0x30) < 10) ||
       ((bVar3 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0)))) {
      if ((local_150 == 0) || (__return_storage_ptr__->_M_string_length < local_150)) {
        std::__cxx11::string::_M_assign((string *)&local_158);
        pbVar15 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pbVar15 != paVar1) {
        operator_delete(pbVar15,paVar1->_M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0018b1fe;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) goto LAB_0018b998;
LAB_0018b9fc:
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    goto LAB_0018b998;
  }
LAB_0018b1fe:
  local_160 = (double)CONCAT44(local_160._4_4_,(undefined4)local_168);
  detail::unit_data::inv((unit_data *)((long)&local_168 + 4));
  find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_1b0);
  paVar1 = &local_1b0.field_2;
  numOnly = extraout_DL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    numOnly = extraout_DL_00;
  }
  if (local_110 != 0) {
    getMultiplierString_abi_cxx11_
              (&local_1b0,
               (units *)(ulong)((byte)(*(char *)((long)local_118 + local_110 + -1) - 0x30U) < 10),
               1.0 / local_170,(bool)numOnly);
    paVar2 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"1/(","");
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1b0._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_118);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    if (local_1b0._M_string_length == 0) {
      bVar7 = false;
    }
    else {
      bVar3 = *local_1b0._M_dataplus._M_p;
      if (9 < (byte)(bVar3 - 0x30)) {
        bVar7 = false;
        if ((0x2e < bVar3) ||
           (bVar7 = false, (0x680000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) == 0))
        goto LAB_0018b384;
      }
      if ((local_150 == 0) || (__return_storage_ptr__->_M_string_length < local_150)) {
        std::__cxx11::string::operator=((string *)&local_158,(string *)__return_storage_ptr__);
      }
      pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
      bVar7 = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar2) {
        operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
      }
    }
LAB_0018b384:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar7) goto LAB_0018b998;
  }
  pVar17 = precise_unit::operator/((precise_unit *)this,un);
  local_170 = pVar17.multiplier_;
  local_168 = pVar17._8_8_ << 0x20 | 0x3f800000;
  find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != 0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_118,(long)&(local_118->_M_dataplus)._M_p + local_110);
    generateUnitSequence(&local_1b0,local_170,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_190 = &local_180;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_190,local_188,0,'\x01');
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_190);
    paVar2 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar12) {
      lVar6 = plVar9[3];
      paVar2->_M_allocated_capacity = *psVar12;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    }
    __return_storage_ptr__->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    pbVar15 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    bVar3 = *pbVar15;
    if ((9 < (byte)(bVar3 - 0x30)) &&
       ((0x2e < bVar3 || ((0x680000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) == 0)))) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p == paVar1) goto LAB_0018b998;
      goto LAB_0018b9fc;
    }
    if ((local_150 == 0) || (__return_storage_ptr__->_M_string_length < local_150)) {
      std::__cxx11::string::_M_assign((string *)&local_158);
      pbVar15 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pbVar15 != paVar2) {
      operator_delete(pbVar15,paVar2->_M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  local_160 = (double)CONCAT44(local_160._4_4_,(undefined4)local_168);
  detail::unit_data::inv((unit_data *)((long)&local_168 + 4));
  find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != 0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_118,(long)&(local_118->_M_dataplus)._M_p + local_110);
    generateUnitSequence(&local_1b0,1.0 / local_170,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = *local_1b0._M_dataplus._M_p;
    if (((byte)(bVar3 - 0x30) < 10) ||
       ((bVar3 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0)))) {
      local_b8 = 0;
      dVar5 = getDoubleFromString(&local_1b0,&local_b8);
      getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,1.0 / dVar5,numOnly_00);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_c8 = *plVar13;
        lStack_c0 = plVar9[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar13;
        local_d8 = (long *)*plVar9;
      }
      local_d0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
      puVar14 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar14) {
        local_128 = *puVar14;
        lStack_120 = plVar9[3];
        local_138 = &local_128;
      }
      else {
        local_128 = *puVar14;
        local_138 = (ulong *)*plVar9;
      }
      local_130 = plVar9[1];
      *plVar9 = (long)puVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::substr((ulong)&local_108.field_2,(ulong)&local_1b0);
      uVar16 = 0xf;
      if (local_138 != &local_128) {
        uVar16 = local_128;
      }
      if (uVar16 < (ulong)(local_108.field_2._8_8_ + local_130)) {
        uVar16 = 0xf;
        if ((ulong *)local_108.field_2._M_allocated_capacity != local_e8) {
          uVar16 = local_e8[0];
        }
        if (uVar16 < (ulong)(local_108.field_2._8_8_ + local_130)) goto LAB_0018b814;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_108.field_2,0,(char *)0x0,(ulong)local_138);
      }
      else {
LAB_0018b814:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_138,local_108.field_2._M_allocated_capacity);
      }
      local_190 = &local_180;
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_180 = *plVar9;
        uStack_178 = puVar10[3];
      }
      else {
        local_180 = *plVar9;
        local_190 = (long *)*puVar10;
      }
      local_188 = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)plVar9 = 0;
      if ((ulong *)local_108.field_2._M_allocated_capacity != local_e8) {
        operator_delete((void *)local_108.field_2._M_allocated_capacity,local_e8[0] + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_188 <= local_150 - 1) {
        std::__cxx11::string::_M_assign((string *)&local_158);
      }
      if (local_190 != &local_180) {
        operator_delete(local_190,local_180 + 1);
      }
      bVar7 = true;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_138,(char *)un[1].multiplier_,(allocator *)&local_d8);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_180 = *plVar9;
        uStack_178 = puVar10[3];
        local_190 = &local_180;
      }
      else {
        local_180 = *plVar9;
        local_190 = (long *)*puVar10;
      }
      local_188 = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_190,(ulong)local_1b0._M_dataplus._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar12) {
        lVar6 = plVar9[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      }
      __return_storage_ptr__->_M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_190 != &local_180) {
        operator_delete(local_190,local_180 + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar7) goto LAB_0018b998;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_158 == &local_148) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_147,local_148);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_140;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_158;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_147,local_148);
  }
  __return_storage_ptr__->_M_string_length = local_150;
  local_150 = 0;
  local_148 = '\0';
  local_158 = &local_148;
LAB_0018b998:
  psVar11 = &local_108;
  if (local_118 != psVar11) {
    operator_delete(local_118,(ulong)(local_108._M_dataplus._M_p + 1));
    psVar11 = extraout_RAX;
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
    psVar11 = extraout_RAX_00;
  }
  return psVar11;
}

Assistant:

static std::string probeUnitBase(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    std::string beststr;
    // let's try common divisor units on base units
    auto ext = un * probe.first;
    auto base = unit(ext.base_units());
    auto fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);

        auto str = prefix + '/' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try inverse of common multiplier units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = getMultiplierString(
            1.0 / ext.multiplier(), isDigitCharacter(fnd.back()));
        std::string str{"1/("};
        str += prefix;
        str += fnd;
        str.push_back('*');
        str.append(probe.second);
        str.push_back(')');
        if (prefix.empty() || !isNumericalStartCharacter(prefix.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = std::move(str);
        }
    }
    // let's try common multiplier units on base units
    ext = un / probe.first;
    base = unit(ext.base_units());
    fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);
        auto str = prefix + '*' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try common divisor with inv units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(1.0 / ext.multiplier(), fnd);
        if (isNumericalStartCharacter(prefix.front())) {
            size_t cut{0};
            double mx = getDoubleFromString(prefix, &cut);

            auto str = getMultiplierString(1.0 / mx, true) + probe.second +
                "/" + prefix.substr(cut);
            if (beststr.empty() || str.size() < beststr.size()) {
                beststr = str;
            }

        } else {
            return std::string(probe.second) + "/" + prefix;
        }
    }
    return beststr;
}